

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

bam1_t * bam_copy1(bam1_t *bdst,bam1_t *bsrc)

{
  undefined8 uVar1;
  uint8_t *puVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint uVar10;
  uint8_t *__ptr;
  int iVar11;
  
  __ptr = bdst->data;
  iVar11 = bdst->m_data;
  if (iVar11 < bsrc->l_data) {
    uVar10 = bsrc->l_data - 1;
    uVar10 = (int)uVar10 >> 1 | uVar10;
    uVar10 = (int)uVar10 >> 2 | uVar10;
    uVar10 = (int)uVar10 >> 4 | uVar10;
    uVar10 = (int)uVar10 >> 8 | uVar10;
    iVar11 = ((int)uVar10 >> 0x10 | uVar10) + 1;
    __ptr = (uint8_t *)realloc(__ptr,(long)iVar11);
  }
  memcpy(__ptr,bsrc->data,(long)bsrc->l_data);
  iVar4 = (bsrc->core).tid;
  iVar5 = (bsrc->core).pos;
  uVar1 = *(undefined8 *)&(bsrc->core).field_0x8;
  iVar6 = (bsrc->core).l_qseq;
  iVar7 = (bsrc->core).mtid;
  iVar8 = (bsrc->core).mpos;
  iVar9 = (bsrc->core).isize;
  iVar3 = bsrc->m_data;
  puVar2 = bsrc->data;
  bdst->l_data = bsrc->l_data;
  bdst->m_data = iVar3;
  bdst->data = puVar2;
  (bdst->core).tid = iVar4;
  (bdst->core).pos = iVar5;
  *(undefined8 *)&(bdst->core).field_0x8 = uVar1;
  (bdst->core).l_qseq = iVar6;
  (bdst->core).mtid = iVar7;
  (bdst->core).mpos = iVar8;
  (bdst->core).isize = iVar9;
  bdst->id = bsrc->id;
  bdst->m_data = iVar11;
  bdst->data = __ptr;
  return bdst;
}

Assistant:

bam1_t *bam_copy1(bam1_t *bdst, const bam1_t *bsrc)
{
    uint8_t *data = bdst->data;
    int m_data = bdst->m_data;   // backup data and m_data
    if (m_data < bsrc->l_data) { // double the capacity
        m_data = bsrc->l_data; kroundup32(m_data);
        data = (uint8_t*)realloc(data, m_data);
    }
    memcpy(data, bsrc->data, bsrc->l_data); // copy var-len data
    *bdst = *bsrc; // copy the rest
    // restore the backup
    bdst->m_data = m_data;
    bdst->data = data;
    return bdst;
}